

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

int max_block_wide(MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane)

{
  uint uVar1;
  undefined3 in_register_00000031;
  
  uVar1 = (uint)block_size_wide[CONCAT31(in_register_00000031,bsize)];
  if (xd->mb_to_right_edge < 0) {
    uVar1 = (uint)block_size_wide[CONCAT31(in_register_00000031,bsize)] +
            (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f));
  }
  return (int)uVar1 >> 2;
}

Assistant:

static inline int max_block_wide(const MACROBLOCKD *xd, BLOCK_SIZE bsize,
                                 int plane) {
  assert(bsize < BLOCK_SIZES_ALL);
  int max_blocks_wide = block_size_wide[bsize];

  if (xd->mb_to_right_edge < 0) {
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    max_blocks_wide += xd->mb_to_right_edge >> (3 + pd->subsampling_x);
  }

  // Scale the width in the transform block unit.
  return max_blocks_wide >> MI_SIZE_LOG2;
}